

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall
slang::SVInt::writeTo
          (SVInt *this,SmallVectorBase<char> *buffer,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  ulong uVar1;
  uint64_t *puVar2;
  pointer pcVar3;
  ulong *puVar4;
  byte bVar5;
  void *pvVar6;
  long lVar7;
  logic_t lVar8;
  bitwidth_t bVar9;
  uint uVar10;
  uint uVar11;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar12;
  pointer pcVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  LiteralBase LVar20;
  char cVar21;
  uint32_t value;
  SVInt *pSVar22;
  int iVar23;
  ulong uVar24;
  size_type sVar25;
  SmallVectorBase<char> *this_00;
  bool bVar26;
  double dVar27;
  double __x;
  double __y;
  optional<unsigned_long> oVar28;
  SVInt divisor;
  SVInt remainder;
  SVInt quotient;
  SVInt tmp;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_88;
  uint uStack_80;
  undefined1 uStack_7c;
  byte bStack_7b;
  SmallVectorBase<char> *local_78;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_70;
  uint local_68;
  undefined1 local_64;
  byte bStack_63;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_60;
  uint local_58;
  ushort local_54;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_50;
  uint local_48;
  byte local_43;
  SVInt *local_40;
  size_type local_38;
  
  local_78 = buffer;
  SVInt((SVInt *)&local_50,&this->super_SVIntStorage);
  if (((((this->super_SVIntStorage).signFlag == true) &&
       ((this->super_SVIntStorage).unknownFlag == false)) &&
      (lVar8 = operator[](this,(this->super_SVIntStorage).bitWidth - 1), lVar8.value != '\0')) &&
     ((lVar8.value != '@' && (lVar8.value != 0x80)))) {
    operator-((SVInt *)&local_88);
    operator=((SVInt *)&local_50,(SVInt *)&local_88);
    if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
       (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,CONCAT51(local_88.val._1_5_,local_88.val._0_1_)
                                 ), pvVar6 != (void *)0x0)) {
      operator_delete__(pvVar6);
    }
    local_88.val._0_1_ = 0x2d;
    SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
  }
  local_40 = this;
  bVar9 = getActiveBits((SVInt *)&local_50);
  LVar20 = Decimal;
  if (bVar9 <= abbreviateThresholdBits) {
    LVar20 = base;
  }
  if (abbreviateThresholdBits < bVar9 || includeBase) {
    uintToStr(local_78,(local_40->super_SVIntStorage).bitWidth);
    local_88.val._0_1_ = 0x27;
    SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
    if ((local_40->super_SVIntStorage).signFlag == true) {
      local_88.val._0_1_ = 0x73;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
    }
    switch(LVar20) {
    case Binary:
      local_88.val._0_1_ = 0x62;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
      break;
    case Octal:
      local_88.val._0_1_ = 0x6f;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
      break;
    case Decimal:
      local_88.val._0_1_ = 100;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
      break;
    case Hex:
      local_88.val._0_1_ = 0x68;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
    }
  }
  uVar10 = local_48;
  this_00 = local_78;
  sVar25 = local_78->len;
  switch(LVar20) {
  case Binary:
    iVar23 = 1;
    uVar14 = 1;
    break;
  case Octal:
    uVar14 = 7;
    iVar23 = 3;
    break;
  case Decimal:
    if ((local_40->super_SVIntStorage).unknownFlag != true) {
      pSVar22 = (SVInt *)0x0;
      if (abbreviateThresholdBits <= bVar9 && bVar9 - abbreviateThresholdBits != 0) {
        local_40 = (SVInt *)log2_10;
        __y = log2_10;
        dVar27 = ceil((double)(bVar9 - abbreviateThresholdBits) / log2_10);
        pSVar22 = (SVInt *)0x5;
        if (5 < (uint)(long)dVar27) {
          pSVar22 = (SVInt *)((long)dVar27 & 0xffffffff);
        }
        dVar27 = ceil((double)(long)pSVar22 * (double)local_40);
        SVInt((SVInt *)&local_88,(bitwidth_t)(long)dVar27,10,false);
        SVInt<unsigned_int,void>((SVInt *)&local_60,(uint)pSVar22);
        pow((SVInt *)&local_70,__x,__y);
        operator=((SVInt *)&local_88,(SVInt *)&local_70);
        if (((0x40 < local_68) || ((bStack_63 & 1) != 0)) &&
           ((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_) != (void *)0x0)) {
          operator_delete__((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_));
        }
        if (((0x40 < local_58) || ((local_54 & 0x100) != 0)) &&
           ((void *)local_60.val != (void *)0x0)) {
          operator_delete__(local_60.pVal);
        }
        local_70.val._0_6_ = 0;
        local_70.val._6_2_ = 0;
        local_68 = 1;
        local_64 = 0;
        bStack_63 = 0;
        local_60.val = 0;
        local_58 = 1;
        local_54 = 0;
        divide((SVInt *)&local_50,(local_48 + 0x3f >> 6) << (local_43 & 0x1f),(SVInt *)&local_88,
               (uStack_80 + 0x3f >> 6) << (bStack_7b & 0x1f),(SVInt *)&local_60,(SVInt *)&local_70);
        operator=((SVInt *)&local_50,(SVInt *)&local_60);
        if (((0x40 < local_58) || ((local_54 & 0x100) != 0)) &&
           ((void *)local_60.val != (void *)0x0)) {
          operator_delete__(local_60.pVal);
        }
        if (((0x40 < local_68) || ((bStack_63 & 1) != 0)) &&
           ((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_) != (void *)0x0)) {
          operator_delete__((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_));
        }
        if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
           (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,
                                      CONCAT51(local_88.val._1_5_,local_88.val._0_1_)),
           pvVar6 != (void *)0x0)) {
          operator_delete__(pvVar6);
        }
      }
      uStack_80 = 4;
      uStack_7c = 0;
      bStack_7b = 0;
      local_88.val._0_1_ = 10;
      local_88.val._1_5_ = 0;
      local_88.val._6_2_ = 0;
      local_40 = pSVar22;
      local_38 = sVar25;
      clearUnusedBits((SVInt *)&local_88);
      uVar10 = uStack_80 + 0x3f;
      bVar5 = bStack_7b & 0x1f;
      while( true ) {
        bStack_63 = 0;
        local_70.val._0_6_ = 0;
        local_70.val._6_2_ = 0;
        local_64 = 1;
        local_68 = 1;
        clearUnusedBits((SVInt *)&local_70);
        lVar8 = operator==((SVInt *)&local_50,(SVInt *)&local_70);
        if (((0x40 < local_68) || ((bStack_63 & 1) != 0)) &&
           ((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_) != (void *)0x0)) {
          operator_delete__((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_));
        }
        if (lVar8.value != '\0') break;
        local_70.val._0_6_ = 0;
        local_70.val._6_2_ = 0;
        local_68 = 1;
        local_64 = 0;
        bStack_63 = 0;
        local_60.val = 0;
        local_58 = 1;
        local_54 = 0;
        divide((SVInt *)&local_50,(local_48 + 0x3f >> 6) << (local_43 & 0x1f),(SVInt *)&local_88,
               (uVar10 >> 6) << bVar5,(SVInt *)&local_60,(SVInt *)&local_70);
        oVar28 = as<unsigned_long,void>((SVInt *)&local_70);
        if (((undefined1  [16])
             oVar28.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
            (undefined1  [16])0x0) {
          std::__throw_bad_optional_access();
        }
        if (9 < oVar28.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload) {
          assert::assertFailed
                    ("digit < 10",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
                     ,0x30c,
                     "void slang::SVInt::writeTo(SmallVectorBase<char> &, LiteralBase, bool, bitwidth_t) const"
                    );
        }
        SmallVectorBase<char>::emplace_back<char_const&>
                  (local_78,"0123456789abcdef" +
                            oVar28.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long>._M_payload);
        operator=((SVInt *)&local_50,(SVInt *)&local_60);
        if (((0x40 < local_58) || ((local_54 & 0x100) != 0)) &&
           ((void *)local_60.val != (void *)0x0)) {
          operator_delete__(local_60.pVal);
        }
        if (((0x40 < local_68) || ((bStack_63 & 1) != 0)) &&
           ((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_) != (void *)0x0)) {
          operator_delete__((void *)CONCAT26(local_70.val._6_2_,local_70.val._0_6_));
        }
      }
      if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
         (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,
                                    CONCAT51(local_88.val._1_5_,local_88.val._0_1_)),
         pvVar6 != (void *)0x0)) {
        operator_delete__(pvVar6);
      }
      value = (uint32_t)local_40;
      sVar25 = local_38;
      this_00 = local_78;
      goto LAB_0018738f;
    }
    uVar10 = (local_40->super_SVIntStorage).bitWidth;
    uVar14 = uVar10 & 0x3f;
    uVar10 = uVar10 + 0x3f >> 6;
    uVar19 = -(ulong)(uVar14 == 0) | ~(-1L << (sbyte)uVar14);
    uVar14 = uVar10 - 1;
    uVar16 = (ulong)uVar14;
    if (uVar14 == 0) {
LAB_00187773:
      bVar26 = (local_40->super_SVIntStorage).field_0.pVal[uVar14 + uVar10] == uVar19;
    }
    else {
      puVar2 = (local_40->super_SVIntStorage).field_0.pVal;
      if (puVar2[uVar10] == 0xffffffffffffffff) {
        uVar24 = 0;
        do {
          if (uVar16 - 1 == uVar24) goto LAB_00187773;
          iVar23 = (int)uVar24;
          uVar24 = uVar24 + 1;
        } while (puVar2[uVar10 + 1 + iVar23] == 0xffffffffffffffff);
        if (uVar16 <= uVar24) goto LAB_00187773;
      }
      bVar26 = false;
    }
    if (bVar26) {
      if (uVar14 != 0) {
        puVar2 = (local_40->super_SVIntStorage).field_0.pVal;
        if (*puVar2 == 0xffffffffffffffff) {
          uVar24 = 0;
          do {
            if (uVar16 - 1 == uVar24) goto LAB_001877b8;
            uVar1 = uVar24 + 1;
            lVar7 = uVar24 + 1;
            uVar24 = uVar1;
          } while (puVar2[lVar7] == 0xffffffffffffffff);
          if (uVar16 <= uVar1) goto LAB_001877b8;
        }
LAB_001877d4:
        if (bVar26) {
          if (uVar14 == 0) {
LAB_00187806:
            if ((local_40->super_SVIntStorage).field_0.pVal[uVar16] == 0) {
              local_88.val._0_1_ = 0x78;
              SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
              goto LAB_00187885;
            }
          }
          else {
            puVar2 = (local_40->super_SVIntStorage).field_0.pVal;
            if (*puVar2 == 0) {
              uVar24 = 0;
              do {
                if (uVar16 - 1 == uVar24) goto LAB_00187806;
                uVar1 = uVar24 + 1;
                lVar7 = uVar24 + 1;
                uVar24 = uVar1;
              } while (puVar2[lVar7] == 0);
              if (uVar16 <= uVar1) goto LAB_00187806;
            }
          }
        }
        goto LAB_00187810;
      }
LAB_001877b8:
      if ((local_40->super_SVIntStorage).field_0.pVal[uVar16] != uVar19) goto LAB_001877d4;
      local_88.val._0_1_ = 0x7a;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
    }
    else {
LAB_00187810:
      if (uVar14 == 0) {
LAB_0018784d:
        puVar2 = (local_40->super_SVIntStorage).field_0.pVal;
        if ((~puVar2[uVar16] & puVar2[uVar10 * 2 - 1] & uVar19) == 0) {
          local_88.val._0_1_ = 0x5a;
          SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
          goto LAB_00187885;
        }
      }
      else {
        puVar4 = (local_40->super_SVIntStorage).field_0.pVal;
        if ((puVar4[uVar10] & ~*puVar4) == 0) {
          uVar24 = 0;
          do {
            if (uVar16 - 1 == uVar24) goto LAB_0018784d;
            lVar7 = uVar24 + 1;
            iVar23 = (int)uVar24;
            uVar24 = uVar24 + 1;
          } while ((puVar4[uVar10 + 1 + iVar23] & ~puVar4[lVar7]) == 0);
          if (uVar16 <= uVar24) goto LAB_0018784d;
        }
      }
      local_88.val._0_1_ = 0x58;
      SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
    }
LAB_00187885:
    value = 0;
    goto LAB_0018738f;
  case Hex:
    uVar14 = 0xf;
    iVar23 = 4;
    break;
  default:
    iVar23 = 0;
    uVar14 = 0;
  }
  bStack_7b = 0;
  local_88.val._0_1_ = 0;
  local_88.val._1_5_ = 0;
  local_88.val._6_2_ = 0;
  uStack_7c = 1;
  uStack_80 = 1;
  local_38 = sVar25;
  clearUnusedBits((SVInt *)&local_88);
  lVar8 = operator==((SVInt *)&local_50,(SVInt *)&local_88);
  bVar26 = false;
  if ((lVar8.value != '@') && (lVar8.value != 0x80)) {
    bVar26 = lVar8.value == '\0';
  }
  if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
     (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,CONCAT51(local_88.val._1_5_,local_88.val._0_1_)),
     pvVar6 != (void *)0x0)) {
    operator_delete__(pvVar6);
  }
  if (bVar26) {
    do {
      uVar11 = ~(-1 << ((byte)uVar10 & 0x1f));
      if (iVar23 <= (int)uVar10) {
        uVar11 = uVar14;
      }
      uVar14 = uVar11;
      aVar12.pVal = (uint64_t *)&local_50;
      if ((local_43 & 1) != 0) {
        aVar12 = local_50;
      }
      if (0x40 < local_48) {
        aVar12 = local_50;
      }
      uVar11 = (uint)*aVar12.pVal & uVar14;
      if ((local_43 & 1) == 0) {
        SmallVectorBase<char>::emplace_back<char_const&>(local_78,"0123456789abcdef" + uVar11);
      }
      else {
        uVar15 = *(uint *)(local_50.pVal + ((local_40->super_SVIntStorage).bitWidth + 0x3f >> 6)) &
                 uVar14;
        if (uVar15 == 0) {
          SmallVectorBase<char>::emplace_back<char_const&>(local_78,"0123456789abcdef" + uVar11);
        }
        else if ((uVar15 == uVar14) && (uVar11 == 0)) {
          local_88.val._0_1_ = 0x78;
          SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
        }
        else if ((uVar15 == uVar14) && (uVar11 == uVar14)) {
          local_88.val._0_1_ = 0x7a;
          SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
        }
        else if ((uVar15 & ~uVar11) == 0) {
          local_88.val._0_1_ = 0x5a;
          SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
        }
        else {
          local_88.val._0_1_ = 0x58;
          SmallVectorBase<char>::emplace_back<char>(local_78,(char *)&local_88.val);
        }
      }
      lshr((SVInt *)&local_88,(bitwidth_t)&local_50);
      operator=((SVInt *)&local_50,(SVInt *)&local_88);
      if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
         (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,
                                    CONCAT51(local_88.val._1_5_,local_88.val._0_1_)),
         pvVar6 != (void *)0x0)) {
        operator_delete__(pvVar6);
      }
      bStack_7b = 0;
      local_88.val._0_1_ = 0;
      local_88.val._1_5_ = 0;
      local_88.val._6_2_ = 0;
      uStack_7c = 1;
      uStack_80 = 1;
      clearUnusedBits((SVInt *)&local_88);
      lVar8 = operator==((SVInt *)&local_50,(SVInt *)&local_88);
      bVar26 = false;
      cVar21 = -0x80;
      if ((lVar8.value != '@') && (lVar8.value != 0x80)) {
        bVar26 = lVar8.value == '\0';
        cVar21 = bVar26;
      }
      if (((0x40 < uStack_80) || ((bStack_7b & 1) != 0)) &&
         (pvVar6 = (void *)CONCAT26(local_88.val._6_2_,
                                    CONCAT51(local_88.val._1_5_,local_88.val._0_1_)),
         pvVar6 != (void *)0x0)) {
        operator_delete__(pvVar6);
      }
      uVar10 = uVar10 - iVar23;
    } while ((bool)(cVar21 == -0x80 | bVar26));
  }
  value = 0;
  sVar25 = local_38;
  this_00 = local_78;
LAB_0018738f:
  if (sVar25 == this_00->len) {
    local_88.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>(this_00,(char *)&local_88.val);
  }
  else {
    pcVar3 = this_00->data_;
    pcVar13 = pcVar3 + (this_00->len - 1);
    if (pcVar3 + sVar25 < pcVar13) {
      pcVar18 = pcVar3 + sVar25;
      do {
        pcVar17 = pcVar18 + 1;
        cVar21 = *pcVar18;
        *pcVar18 = *pcVar13;
        *pcVar13 = cVar21;
        pcVar13 = pcVar13 + -1;
        pcVar18 = pcVar17;
      } while (pcVar17 < pcVar13);
    }
    if (value != 0) {
      sVar25 = this_00->len + 4;
      SmallVectorBase<char>::reserve(this_00,sVar25);
      builtin_strncpy(this_00->data_ + this_00->len,"...e",4);
      this_00->len = sVar25;
      uintToStr(this_00,value);
    }
  }
  if (((0x40 < local_48) || ((local_43 & 1) != 0)) &&
     ((anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)local_50.val !=
      (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0)) {
    operator_delete__(local_50.pVal);
  }
  return;
}

Assistant:

void SVInt::writeTo(SmallVectorBase<char>& buffer, LiteralBase base, bool includeBase,
                    bitwidth_t abbreviateThresholdBits) const {
    // negative sign if necessary
    SVInt tmp(*this);
    if (signFlag && !unknownFlag && isNegative()) {
        tmp = -tmp;
        buffer.push_back('-');
    }

    // If the number is larger than the threshold to abbreviate,
    // force it to print as a decimal.
    bitwidth_t activeBits = tmp.getActiveBits();
    if (activeBits > abbreviateThresholdBits) {
        includeBase = true;
        base = LiteralBase::Decimal;
    }

    if (includeBase) {
        uintToStr(buffer, bitWidth);
        buffer.push_back('\'');
        if (signFlag)
            buffer.push_back('s');
        switch (base) {
            case LiteralBase::Binary:
                buffer.push_back('b');
                break;
            case LiteralBase::Octal:
                buffer.push_back('o');
                break;
            case LiteralBase::Decimal:
                buffer.push_back('d');
                break;
            case LiteralBase::Hex:
                buffer.push_back('h');
                break;
        }
    }

    uint32_t base10Exponent = 0;
    size_t startOffset = buffer.size();
    static const char Digits[] = "0123456789abcdef";
    if (base == LiteralBase::Decimal) {
        // decimal numbers that have unknown values only print as a single letter,
        // with the following rules:
        // - If all bits are unknown, print 'x'
        // - If all bits are high impendance, print 'z'
        // - If some bits are unknown, print 'X'
        // - Otherwise, if some bits are high impedance , print 'Z'
        if (unknownFlag) {
            uint64_t mask;
            bitwidth_t bitsInMsw;
            uint32_t words = getNumWords(bitWidth, false);
            getTopWordMask(bitsInMsw, mask);

            auto all = [&](uint32_t start, uint64_t v) {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if (pVal[start + i] != v)
                        return false;
                }

                return pVal[start + words - 1] == (mask & v);
            };

            auto anyXs = [&]() {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if ((~pVal[i] & pVal[i + words]) != 0)
                        return true;
                }

                return (~pVal[words - 1] & mask & pVal[words * 2 - 1]) != 0;
            };

            bool upperOnes = all(words, UINT64_MAX);
            if (upperOnes && all(0, UINT64_MAX))
                buffer.push_back('z');
            else if (upperOnes && all(0, 0))
                buffer.push_back('x');
            else if (anyXs())
                buffer.push_back('X');
            else
                buffer.push_back('Z');
        }
        else {
            // Limit the size of the output string based on the given threshold.
            if (activeBits > abbreviateThresholdBits) {
                base10Exponent =
                    std::max(5u, (uint32_t)ceil((activeBits - abbreviateThresholdBits) / log2_10));
                SVInt divisor(bitwidth_t(ceil(base10Exponent * log2_10)), 10, false);
                divisor = divisor.pow(base10Exponent);

                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                tmp = quotient;
            }

            // repeatedly divide by 10 to get each digit
            SVInt divisor(4, 10, false);
            while (tmp != 0) {
                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                uint64_t digit = remainder.as<uint64_t>().value();
                ASSERT(digit < 10);
                buffer.push_back(Digits[digit]);
                tmp = quotient;
            }
        }
    }
    else {
        // for bases 2, 8, and 16 we can just shift instead of dividing
        uint32_t shiftAmount = 0;
        uint32_t maskAmount = 0;
        switch (base) {
            case LiteralBase::Binary:
                shiftAmount = 1;
                maskAmount = 1;
                break;
            case LiteralBase::Octal:
                shiftAmount = 3;
                maskAmount = 7;
                break;
            case LiteralBase::Hex:
                shiftAmount = 4;
                maskAmount = 15;
                break;
            case LiteralBase::Decimal:
                ASSUME_UNREACHABLE;
        }

        // if we have unknown values here, the comparison will return X
        // we want to keep going so that we print the unknowns
        int bitsLeft = int(tmp.getBitWidth());
        logic_t x = tmp != 0;
        while (x || x.isUnknown()) {
            if (bitsLeft < int(shiftAmount))
                maskAmount = (1 << bitsLeft) - 1;

            uint32_t digit = uint32_t(tmp.getRawData()[0]) & maskAmount;
            if (!tmp.unknownFlag)
                buffer.push_back(Digits[digit]);
            else {
                uint32_t u = uint32_t(tmp.pVal[getNumWords(bitWidth, false)]) & maskAmount;
                if (!u)
                    buffer.push_back(Digits[digit]);
                else if (u == maskAmount && (digit & maskAmount) == 0)
                    buffer.push_back('x');
                else if (u == maskAmount && digit == maskAmount)
                    buffer.push_back('z');
                else if (~digit & u)
                    buffer.push_back('X');
                else
                    buffer.push_back('Z');
            }
            // this shift might shift away the unknown digits, at which point
            // it converts back to being a normal 2-state value
            tmp = tmp.lshr(shiftAmount);
            bitsLeft -= int(shiftAmount);
            x = tmp != 0;
        }
    }

    // no digits means this is zero
    if (startOffset == buffer.size())
        buffer.push_back('0');
    else {
        // reverse the digits
        std::reverse(buffer.begin() + startOffset, buffer.end());
        if (base10Exponent > 0) {
            buffer.append("...e"sv);
            uintToStr(buffer, base10Exponent);
        }
    }
}